

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_readresp(Curl_easy *data,curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  Curl_easy *data_00;
  CURLcode CVar1;
  uint *puVar2;
  char *ptr;
  size_t sVar3;
  void *pvVar4;
  ulong size_00;
  ulong uVar5;
  dynbuf *s;
  size_t length;
  char *nl;
  char *line;
  char buffer [900];
  size_t local_58;
  ssize_t gotbytes;
  size_t full;
  connectdata *pcStack_40;
  CURLcode result;
  connectdata *conn;
  size_t *size_local;
  int *code_local;
  pingpong *pp_local;
  Curl_easy *pCStack_18;
  curl_socket_t sockfd_local;
  Curl_easy *data_local;
  
  pcStack_40 = data->conn;
  full._4_4_ = CURLE_OK;
  *code = 0;
  *size = 0;
  conn = (connectdata *)size;
  size_local = (size_t *)code;
  code_local = (int *)pp;
  pp_local._4_4_ = sockfd;
  pCStack_18 = data;
  if (pp->nfinal != 0) {
    gotbytes = Curl_dyn_len(&pp->recvbuf);
    Curl_dyn_tail((dynbuf *)(code_local + 0x18),gotbytes - *(long *)(code_local + 0x22));
    code_local[0x22] = 0;
    code_local[0x23] = 0;
  }
  if (*(long *)(code_local + 0x20) == 0) {
    local_58 = 0;
    full._4_4_ = pingpong_read(pCStack_18,pp_local._4_4_,(char *)&line,900,(ssize_t *)&local_58);
    data_00 = pCStack_18;
    if (full._4_4_ == CURLE_AGAIN) {
      return CURLE_OK;
    }
    if (full._4_4_ != CURLE_OK) {
      return full._4_4_;
    }
    if ((long)local_58 < 1) {
      puVar2 = (uint *)__errno_location();
      Curl_failf(data_00,"response reading failed (errno: %d)",(ulong)*puVar2);
      return CURLE_RECV_ERROR;
    }
    CVar1 = Curl_dyn_addn((dynbuf *)(code_local + 0x18),&line,local_58);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    (pCStack_18->req).headerbytecount = (int)local_58 + (pCStack_18->req).headerbytecount;
    *(size_t *)code_local = local_58 + *(long *)code_local;
    full._4_4_ = CURLE_OK;
  }
  do {
    ptr = Curl_dyn_ptr((dynbuf *)(code_local + 0x18));
    sVar3 = Curl_dyn_len((dynbuf *)(code_local + 0x18));
    pvVar4 = memchr(ptr,10,sVar3);
    if (pvVar4 == (void *)0x0) {
      code_local[0x20] = 0;
      code_local[0x21] = 0;
LAB_00d1a123:
      *(undefined1 *)(code_local + 2) = 0;
      return full._4_4_;
    }
    size_00 = (long)pvVar4 + (1 - (long)ptr);
    Curl_debug(pCStack_18,CURLINFO_HEADER_IN,ptr,size_00);
    full._4_4_ = Curl_client_write(pCStack_18,2,ptr,size_00);
    if (full._4_4_ != CURLE_OK) {
      return full._4_4_;
    }
    uVar5 = (**(code **)(code_local + 0x26))(pCStack_18,pcStack_40,ptr,size_00,size_local);
    if ((uVar5 & 1) != 0) {
      *(ulong *)(code_local + 0x22) = size_00;
      sVar3 = Curl_dyn_len((dynbuf *)(code_local + 0x18));
      if (size_00 < sVar3) {
        sVar3 = Curl_dyn_len((dynbuf *)(code_local + 0x18));
        *(size_t *)(code_local + 0x20) = sVar3 - size_00;
      }
      else {
        code_local[0x20] = 0;
        code_local[0x21] = 0;
      }
      (conn->bundle_node).ptr = *(void **)code_local;
      code_local[0] = 0;
      code_local[1] = 0;
      goto LAB_00d1a123;
    }
    sVar3 = Curl_dyn_len((dynbuf *)(code_local + 0x18));
    if (size_00 < sVar3) {
      s = (dynbuf *)(code_local + 0x18);
      sVar3 = Curl_dyn_len((dynbuf *)(code_local + 0x18));
      Curl_dyn_tail(s,sVar3 - size_00);
    }
    else {
      Curl_dyn_reset((dynbuf *)(code_local + 0x18));
    }
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(struct Curl_easy *data,
                          curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  if(pp->nfinal) {
    /* a previous call left this many bytes in the beginning of the buffer as
       that was the final line; now ditch that */
    size_t full = Curl_dyn_len(&pp->recvbuf);

    /* trim off the "final" leading part */
    Curl_dyn_tail(&pp->recvbuf, full -  pp->nfinal);

    pp->nfinal = 0; /* now gone */
  }
  if(!pp->overflow) {
    ssize_t gotbytes = 0;
    char buffer[900];

    result = pingpong_read(data, sockfd, buffer, sizeof(buffer), &gotbytes);
    if(result == CURLE_AGAIN)
      return CURLE_OK;

    if(result)
      return result;

    if(gotbytes <= 0) {
      failf(data, "response reading failed (errno: %d)", SOCKERRNO);
      return CURLE_RECV_ERROR;
    }

    result = Curl_dyn_addn(&pp->recvbuf, buffer, gotbytes);
    if(result)
      return result;

    data->req.headerbytecount += (unsigned int)gotbytes;

    pp->nread_resp += gotbytes;
  }

  do {
    char *line = Curl_dyn_ptr(&pp->recvbuf);
    char *nl = memchr(line, '\n', Curl_dyn_len(&pp->recvbuf));
    if(nl) {
      /* a newline is CRLF in pp-talk, so the CR is ignored as
         the line isn't really terminated until the LF comes */
      size_t length = nl - line + 1;

      /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
      if(!conn->sec_complete)
#endif
        Curl_debug(data, CURLINFO_HEADER_IN, line, length);

      /*
       * Pass all response-lines to the callback function registered for
       * "headers". The response lines can be seen as a kind of headers.
       */
      result = Curl_client_write(data, CLIENTWRITE_INFO, line, length);
      if(result)
        return result;

      if(pp->endofresp(data, conn, line, length, code)) {
        /* When at "end of response", keep the endofresp line first in the
           buffer since it will be accessed outside (by pingpong
           parsers). Store the overflow counter to inform about additional
           data in this buffer after the endofresp line. */
        pp->nfinal = length;
        if(Curl_dyn_len(&pp->recvbuf) > length)
          pp->overflow = Curl_dyn_len(&pp->recvbuf) - length;
        else
          pp->overflow = 0;
        *size = pp->nread_resp; /* size of the response */
        pp->nread_resp = 0; /* restart */
        break;
      }
      if(Curl_dyn_len(&pp->recvbuf) > length)
        /* keep the remaining piece */
        Curl_dyn_tail((&pp->recvbuf), Curl_dyn_len(&pp->recvbuf) - length);
      else
        Curl_dyn_reset(&pp->recvbuf);
    }
    else {
      /* without a newline, there is no overflow */
      pp->overflow = 0;
      break;
    }

  } while(1); /* while there's buffer left to scan */

  pp->pending_resp = FALSE;

  return result;
}